

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.h
# Opt level: O0

void __thiscall FastPForLib::CSVFlatFile::CSVFlatFile(CSVFlatFile *this,char *filename,int normtype)

{
  ostream *poVar1;
  int in_EDX;
  char *in_RSI;
  istream *in_RDI;
  char *in_stack_000002a8;
  CSVFlatFile *in_stack_000002b0;
  char *in_stack_00000378;
  CSVFlatFile *in_stack_00000380;
  allocator *paVar2;
  string *in_stack_ffffffffffffffb0;
  istream *in_stack_ffffffffffffffb8;
  CSVReader *in_stack_ffffffffffffffc0;
  string local_38 [36];
  int local_14;
  char *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::ifstream::ifstream(in_RDI);
  paVar2 = (allocator *)&stack0xffffffffffffffc7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,",",paVar2);
  CSVReader::CSVReader
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
             (char)((ulong)paVar2 >> 0x38));
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  *(undefined1 (*) [16])(in_RDI + 0x298) = (undefined1  [16])0x0;
  *(undefined8 *)(in_RDI + 0x2a8) = 0;
  std::
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>_>
  ::vector((vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>_>
            *)0x103307);
  *(undefined8 *)(in_RDI + 0x2b0) = 0;
  poVar1 = std::operator<<((ostream *)&std::cout,"# computing normalization of file ");
  poVar1 = std::operator<<(poVar1,local_10);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  if (local_14 == 0) {
    computeFreqNormalization(in_stack_000002b0,in_stack_000002a8);
  }
  else if (local_14 == 1) {
    computeDomainNormalization(in_stack_00000380,in_stack_00000378);
  }
  std::ifstream::open(in_RDI,local_10,8);
  CSVReader::linkStream((CSVReader *)(in_RDI + 0x208),in_RDI);
  return;
}

Assistant:

CSVFlatFile(const char *filename, const int normtype)
      : in(), mainreader(NULL), mapping(), NumberOfLines(0) {
    std::cout << "# computing normalization of file " << filename << std::endl;
    if (normtype == FREQNORMALISATION)
      computeFreqNormalization(filename);
    else if (normtype == DOMAINNORMALISATION)
      computeDomainNormalization(filename);
    in.open(filename);
    mainreader.linkStream(&in);
  }